

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

string * __thiscall
phosg::format_data_string_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *vdata,size_t size,void *vmask,
          uint64_t flags)

{
  phosg pVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  char *__s;
  string local_50;
  
  bVar2 = ~(byte)vmask & 1;
  if (vdata != (void *)0x0 && ((ulong)vmask & 1) == 0) {
    pvVar4 = (void *)0x1;
    bVar3 = bVar2;
    do {
      pVar1 = (this + -1)[(long)pvVar4];
      if (((0xd < (byte)pVar1) || ((0x2600U >> ((byte)pVar1 & 0x1f) & 1) == 0)) &&
         (bVar2 = bVar3, (byte)((char)pVar1 + 0x81U) < 0xa1)) {
        bVar3 = 0;
        bVar2 = 0;
      }
    } while ((pvVar4 < vdata) && (pvVar4 = (void *)((long)pvVar4 + 1), bVar2 != 0));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (bVar2 == 0) {
    if (vdata != (void *)0x0) {
      bVar2 = 1;
      pvVar4 = (void *)0x0;
      do {
        if ((size != 0) && (!(bool)(*(char *)(size + (long)pvVar4) == '\0' ^ bVar2))) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,'?');
          bVar2 = bVar2 ^ 1;
        }
        string_printf_abi_cxx11_(&local_50,"%02X",(ulong)(byte)this[(long)pvVar4]);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pvVar4 = (void *)((long)pvVar4 + 1);
      } while (vdata != pvVar4);
    }
  }
  else {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\"');
    if (vdata != (void *)0x0) {
      bVar2 = 1;
      pvVar4 = (void *)0x0;
      do {
        if ((size != 0) && (!(bool)(*(char *)(size + (long)pvVar4) == '\0' ^ bVar2))) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,"\"?\"");
          bVar2 = bVar2 ^ 1;
        }
        pVar1 = this[(long)pvVar4];
        if ((byte)pVar1 < 0xd) {
          if (pVar1 == (phosg)0x9) {
            __s = "\\t";
            goto LAB_0010d9e6;
          }
          if (pVar1 == (phosg)0xa) {
            __s = "\\n";
            goto LAB_0010d9e6;
          }
LAB_0010d9ff:
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,(char)pVar1);
        }
        else {
          __s = "\\r";
          if (pVar1 != (phosg)0xd) {
            if (pVar1 == (phosg)0x22) {
              __s = "\\\"";
            }
            else {
              if (pVar1 != (phosg)0x27) goto LAB_0010d9ff;
              __s = "\\\'";
            }
          }
LAB_0010d9e6:
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,__s);
        }
        pvVar4 = (void *)((long)pvVar4 + 1);
      } while (vdata != pvVar4);
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\"');
  }
  return __return_storage_ptr__;
}

Assistant:

string format_data_string(const void* vdata, size_t size, const void* vmask, uint64_t flags) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);
  const uint8_t* mask = reinterpret_cast<const uint8_t*>(vmask);

  // If all bytes are ASCII-printable, render as a string instead
  bool is_printable = !(flags & FormatDataFlags::SKIP_STRINGS);
  if (is_printable) {
    for (size_t z = 0; z < size && is_printable; z++) {
      if (data[z] != '\r' && data[z] != '\n' && data[z] != '\t' && (data[z] < 0x20 || data[z] > 0x7E)) {
        is_printable = false;
      }
    }
  }

  string ret;
  bool mask_enabled = true;
  if (is_printable) {
    ret += '\"';
    for (size_t x = 0; x < size; x++) {
      if (mask && ((bool)mask[x] != mask_enabled)) {
        mask_enabled = !mask_enabled;
        ret += "\"?\"";
      }
      if (data[x] == '\r') {
        ret += "\\r";
      } else if (data[x] == '\t') {
        ret += "\\t";
      } else if (data[x] == '\n') {
        ret += "\\n";
      } else if (data[x] == '\"') {
        ret += "\\\"";
      } else if (data[x] == '\'') {
        ret += "\\\'";
      } else {
        ret.push_back(data[x]);
      }
    }
    ret += '\"';
  } else {
    for (size_t x = 0; x < size; x++) {
      if (mask && ((bool)mask[x] != mask_enabled)) {
        mask_enabled = !mask_enabled;
        ret += '?';
      }
      ret += string_printf("%02X", data[x]);
    }
  }
  return ret;
}